

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space_mixer.c
# Opt level: O2

int space_mixer_start(mixed_segment *segment)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = (ulong)*(byte *)((long)segment->data + 0x542c);
  uVar1 = 0;
  do {
    uVar2 = uVar1;
    if (uVar3 == uVar2) goto LAB_0013edd4;
    uVar1 = uVar2 + 1;
  } while (*(long *)(*(long *)((long)segment->data + 0x10) + uVar2 * 8) != 0);
  mixed_err(0x16);
LAB_0013edd4:
  return (int)(uVar3 <= uVar2);
}

Assistant:

int space_mixer_start(struct mixed_segment *segment){
  struct space_mixer_data *data = (struct space_mixer_data *)segment->data;
  for(int i=0; i<data->channels.count; ++i){
    if(!data->out[i]){
      mixed_err(MIXED_BUFFER_MISSING);
      return 0;
    }
  }
  return 1;
}